

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O2

bool __thiscall ON_NurbsCurve::IsValid(ON_NurbsCurve *this,ON_TextLog *text_log)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  ulong uVar6;
  uint uVar7;
  char *pcVar8;
  double *pdVar9;
  ulong uVar10;
  double *pdVar11;
  int iVar12;
  double dVar13;
  ON_3dPoint P1;
  ON_3dPoint P0;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  uVar2 = this->m_dim;
  if ((int)uVar2 < 1) {
    if (text_log == (ON_TextLog *)0x0) goto LAB_0054b82e;
    pcVar8 = "ON_NurbsCurve.m_dim = %d (should be > 0).\n";
    uVar6 = (ulong)uVar2;
  }
  else {
    uVar3 = this->m_order;
    if (1 < (int)uVar3) {
      uVar7 = this->m_cv_count;
      if ((int)uVar7 < (int)uVar3) {
        if (text_log != (ON_TextLog *)0x0) {
          pcVar8 = "ON_NurbsCurve.m_cv_count = %d (should be >= m_order=%d).\n";
          uVar6 = (ulong)uVar3;
LAB_0054b85a:
          ON_TextLog::Print(text_log,pcVar8,(ulong)uVar7,uVar6);
        }
        goto LAB_0054b82e;
      }
      if ((text_log != (ON_TextLog *)0x0) &&
         (this->m_cv_stride < (int)((uVar2 + 1) - (uint)(this->m_is_rat == 0)))) {
        ON_TextLog::Print(text_log,"ON_NurbsCurve.m_cv_stride = %d (should be >= %d).\n");
      }
      if (this->m_cv == (double *)0x0) {
        if (text_log == (ON_TextLog *)0x0) goto LAB_0054b82e;
        pcVar8 = "ON_NurbsCurve.m_cv is nullptr.\n";
      }
      else if (this->m_knot == (double *)0x0) {
        if (text_log == (ON_TextLog *)0x0) goto LAB_0054b82e;
        pcVar8 = "ON_NurbsCurve.m_knot is nullptr.\n";
      }
      else {
        bVar5 = ON_IsValidKnotVector(this->m_order,this->m_cv_count,this->m_knot,text_log);
        if (bVar5) {
          uVar6 = 0;
          if (0 < this->m_dim) {
            uVar6 = (ulong)((this->m_dim + 1) - (uint)(this->m_is_rat == 0));
          }
          pdVar11 = this->m_cv;
          if (pdVar11 == (double *)0x0) {
            if (text_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(text_log,"cv pointer is null.\n");
            }
          }
          else {
            uVar2 = this->m_cv_count;
            uVar10 = (ulong)uVar2;
            if ((int)uVar2 < 2) {
              if (text_log != (ON_TextLog *)0x0) {
                pcVar8 = "cv_count = %d (must be >= 2).\n";
LAB_0054b97e:
                ON_TextLog::Print(text_log,pcVar8,uVar10);
              }
            }
            else if ((int)uVar6 < 1) {
              if (text_log != (ON_TextLog *)0x0) {
                pcVar8 = "cv_size = %d (must be >= 1).\n";
                uVar10 = 0;
                goto LAB_0054b97e;
              }
            }
            else {
              uVar3 = this->m_cv_stride;
              if ((int)uVar6 <= (int)uVar3) {
                for (uVar7 = 0; uVar7 != uVar2; uVar7 = uVar7 + 1) {
                  for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
                    bVar5 = ON_IsValid(pdVar11[uVar10]);
                    if (!bVar5) {
                      if (text_log != (ON_TextLog *)0x0) {
                        ON_TextLog::Print(text_log,"cv[%d*cv_stride + %d] = %g is not valid.\n",
                                          pdVar11[uVar10],(ulong)uVar7);
                      }
                      goto LAB_0054b985;
                    }
                  }
                  pdVar11 = pdVar11 + uVar3;
                }
                goto LAB_0054b992;
              }
              if (text_log != (ON_TextLog *)0x0) {
                ON_TextLog::Print(text_log,
                                  "cv_stride = %d and cv_size = %d (cv_stride must be >= cv_size).\n"
                                 );
              }
            }
          }
LAB_0054b985:
          bVar5 = ON_IsNotValid();
          if (bVar5) {
LAB_0054b992:
            if (this->m_is_rat != 0) {
              pdVar9 = this->m_cv + this->m_dim;
              uVar2 = this->m_cv_count;
              iVar4 = this->m_order;
              pdVar11 = this->m_knot;
              uVar10 = 0;
              if (0 < (int)uVar2) {
                uVar10 = (ulong)uVar2;
              }
              dVar13 = 0.0;
              iVar12 = 0;
              for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
                dVar1 = *pdVar9;
                iVar12 = iVar12 + 1;
                if (dVar1 != 0.0) {
                  iVar12 = 0;
                }
                if (NAN(dVar1)) {
                  iVar12 = 0;
                }
                if (iVar4 <= iVar12) {
                  if (text_log == (ON_TextLog *)0x0) goto LAB_0054b82e;
                  uVar7 = ((int)uVar6 - iVar4) + 1;
                  pcVar8 = "ON_NurbsCurve.m_cv has zero weights for CV[%d],...,CV[%d].\n";
                  goto LAB_0054b85a;
                }
                if ((pdVar11[uVar6] == pdVar11[(long)iVar4 + (uVar6 - 2)]) &&
                   (!NAN(pdVar11[uVar6]) && !NAN(pdVar11[(long)iVar4 + (uVar6 - 2)]))) {
                  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
                    if (text_log == (ON_TextLog *)0x0) goto LAB_0054b82e;
                    pcVar8 = "ON_NurbsCurve.m_cv has zero weights for CV[%d].\n";
                    uVar6 = uVar6 & 0xffffffff;
                    goto LAB_0054b827;
                  }
                  if ((dVar13 != 0.0) || (NAN(dVar13))) {
                    if (dVar1 * dVar13 <= 0.0) {
                      if (text_log != (ON_TextLog *)0x0) {
                        ON_TextLog::Print(text_log,
                                          "ON_NurbsCurve.m_cv has a zero denominator in the parameter interval [%g,%g].\n"
                                          ,pdVar11[uVar6 - 1]);
                      }
                      goto LAB_0054b82e;
                    }
                  }
                  else {
                    dVar13 = *(double *)(&DAT_006924d0 + (ulong)(0.0 < dVar1) * 8);
                  }
                }
                pdVar9 = pdVar9 + this->m_cv_stride;
              }
              if (((uVar2 == 2) && (this->m_dim < 4)) && (iVar4 == 2)) {
                ON_Curve::PointAtStart(&local_48,&this->super_ON_Curve);
                ON_Curve::PointAtEnd(&local_60,&this->super_ON_Curve);
                bVar5 = ON_3dPoint::operator==(&local_48,&local_60);
                if (bVar5) {
                  if (text_log != (ON_TextLog *)0x0) {
                    ON_TextLog::Print(text_log,"ON_NurbsCurve is a line with no length.\n");
                  }
                  bVar5 = ON_IsNotValid();
                  return bVar5;
                }
              }
            }
            return true;
          }
          if (text_log == (ON_TextLog *)0x0) goto LAB_0054b82e;
          pcVar8 = "ON_NurbsCurve.m_cv[] is not valid.\n";
        }
        else {
          if (text_log == (ON_TextLog *)0x0) goto LAB_0054b82e;
          pcVar8 = "ON_NurbsCurve.m_knot[] is not a valid knot vector.\n";
        }
      }
      ON_TextLog::Print(text_log,pcVar8);
      goto LAB_0054b82e;
    }
    if (text_log == (ON_TextLog *)0x0) goto LAB_0054b82e;
    pcVar8 = "ON_NurbsCurve.m_order = %d (should be >= 2).\n";
    uVar6 = (ulong)uVar3;
  }
LAB_0054b827:
  ON_TextLog::Print(text_log,pcVar8,uVar6);
LAB_0054b82e:
  bVar5 = ON_IsNotValid();
  return bVar5;
}

Assistant:

bool ON_NurbsCurve::IsValid( ON_TextLog* text_log ) const
{
  if ( m_dim <= 0 )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_dim = %d (should be > 0).\n",m_dim);
    }
    return ON_NurbsCurveIsNotValid();
  }
  
  if (m_order < 2 )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_order = %d (should be >= 2).\n",m_order);
    }
    return ON_NurbsCurveIsNotValid();
  }
  
  if (m_cv_count < m_order )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_cv_count = %d (should be >= m_order=%d).\n",m_cv_count,m_order);
    }
    return ON_NurbsCurveIsNotValid();
  }
  
  if (m_cv_stride < CVSize() )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_cv_stride = %d (should be >= %d).\n",m_cv_stride,CVSize());
    }
  }
  
  if (m_cv == nullptr)
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_cv is nullptr.\n");
    }
    return ON_NurbsCurveIsNotValid();
  }
  
  if (m_knot == nullptr)
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_knot is nullptr.\n");
    }
    return ON_NurbsCurveIsNotValid();
  }

  if ( !ON_IsValidKnotVector( m_order, m_cv_count, m_knot, text_log ) ) 
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_knot[] is not a valid knot vector.\n");
    }
    return ON_NurbsCurveIsNotValid();
  }

  if ( !ON_ControlPointsAreValid(CVSize(),m_cv_count,m_cv_stride,m_cv,text_log) )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_cv[] is not valid.\n");
    }
    return ON_NurbsCurveIsNotValid();
  }

  if ( m_is_rat )
  {
    // weights at fully multiple knots must be nonzero
    // partial test for weight function being zero
    double sign = 0.0;
    const double* w = &m_cv[m_dim];
    int zcount = 0;
    int i;
    for ( i = 0; i < m_cv_count; i++, w += m_cv_stride )
    {
      if ( *w == 0.0 )
        zcount++;
      else
        zcount = 0;

      if ( zcount >= m_order )
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsCurve.m_cv has zero weights for CV[%d],...,CV[%d].\n",i-m_order+1,i);
        }
        return ON_NurbsCurveIsNotValid(); // denominator is zero for entire span
      }
      
      if ( m_knot[i] == m_knot[i+m_order-2] ) 
      {
        if ( *w == 0.0 )
        {
          if ( text_log )
          {
            text_log->Print("ON_NurbsCurve.m_cv has zero weights for CV[%d].\n",i);
          }
          return ON_NurbsCurveIsNotValid();
        }
        
        if (sign == 0.0) 
        {
          sign = (*w > 0.0) ? 1.0 : -1.0;
        }
        else if ( *w * sign <= 0.0 ) 
        {
          if ( text_log )
          {
            text_log->Print("ON_NurbsCurve.m_cv has a zero denominator in the parameter interval [%g,%g].\n",
                            m_knot[i-1],m_knot[i]);
          }
          return ON_NurbsCurveIsNotValid();
        }
      }
    }

    if ( m_dim <= 3 && 2 == m_order && 2 == m_cv_count )
    {
      // fix for RR 21239
      // 16 November 2010 Chuck and Dale Lear added m_dim <= 3
      // so the 3d checking does not interfere with applications
      // that use high dimension curves where the start and end
      // points can be arbitrary.
      ON_3dPoint P0 = PointAtStart();
      ON_3dPoint P1 = PointAtEnd();
      if ( P0 == P1 )
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsCurve is a line with no length.\n");
        }
        return ON_NurbsCurveIsNotValid();
      }
    }
  }

  return true;
}